

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall CommandDrawGem::Parse(CommandDrawGem *this,FScanner *sc,bool fullScreenOffsets)

{
  bool bVar1;
  int iVar2;
  int local_30;
  int local_2c;
  bool negative;
  bool fullScreenOffsets_local;
  FScanner *sc_local;
  CommandDrawGem *this_local;
  
  while (bVar1 = FScanner::CheckToken(sc,0x101), bVar1) {
    bVar1 = FScanner::Compare(sc,"wiggle");
    if (bVar1) {
      this->wiggle = true;
    }
    else {
      bVar1 = FScanner::Compare(sc,"translatable");
      if (bVar1) {
        this->translatable = true;
      }
      else {
        bVar1 = FScanner::Compare(sc,"armor");
        if (bVar1) {
          this->armor = true;
        }
        else {
          bVar1 = FScanner::Compare(sc,"interpolate");
          if (bVar1) {
            FScanner::MustGetToken(sc,0x28);
            FScanner::MustGetToken(sc,0x104);
            this->interpolationSpeed = sc->Number;
            FScanner::MustGetToken(sc,0x29);
          }
          else {
            bVar1 = FScanner::Compare(sc,"reverse");
            if (bVar1) {
              this->reverse = true;
            }
            else {
              FScanner::ScriptError(sc,"Unknown drawgem flag \'%s\'.",sc->String);
            }
          }
        }
      }
    }
    bVar1 = FScanner::CheckToken(sc,0x7c);
    if (!bVar1) {
      FScanner::MustGetToken(sc,0x2c);
    }
  }
  FScanner::MustGetToken(sc,0x102);
  iVar2 = SBarInfo::newImage((this->super_SBarInfoCommand).script,sc->String);
  this->chain = iVar2;
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x102);
  iVar2 = SBarInfo::newImage((this->super_SBarInfoCommand).script,sc->String);
  this->gem = iVar2;
  FScanner::MustGetToken(sc,0x2c);
  bVar1 = FScanner::CheckToken(sc,0x2d);
  FScanner::MustGetToken(sc,0x104);
  iVar2 = 1;
  if (bVar1) {
    iVar2 = -1;
  }
  this->leftPadding = iVar2 * sc->Number;
  FScanner::MustGetToken(sc,0x2c);
  bVar1 = FScanner::CheckToken(sc,0x2d);
  FScanner::MustGetToken(sc,0x104);
  iVar2 = 1;
  if (bVar1) {
    iVar2 = -1;
  }
  this->rightPadding = iVar2 * sc->Number;
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x104);
  if (sc->Number < 0) {
    FScanner::ScriptError(sc,"Chain size must be a positive number.");
  }
  this->chainSize = sc->Number + 1;
  FScanner::MustGetToken(sc,0x2c);
  SBarInfoCommand::GetCoordinates
            (&this->super_SBarInfoCommand,sc,fullScreenOffsets,&this->x,&this->y);
  FScanner::MustGetToken(sc,0x3b);
  if ((this->armor & 1U) == 0) {
    if ((((this->super_SBarInfoCommand).script)->interpolateHealth & 1U) == 0) {
      local_2c = this->interpolationSpeed;
    }
    else {
      local_2c = ((this->super_SBarInfoCommand).script)->interpolationSpeed;
    }
    this->interpolationSpeed = local_2c;
  }
  else {
    if ((((this->super_SBarInfoCommand).script)->interpolateArmor & 1U) == 0) {
      local_30 = this->interpolationSpeed;
    }
    else {
      local_30 = ((this->super_SBarInfoCommand).script)->armorInterpolationSpeed;
    }
    this->interpolationSpeed = local_30;
  }
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			while(sc.CheckToken(TK_Identifier))
			{
				if(sc.Compare("wiggle"))
					wiggle = true;
				else if(sc.Compare("translatable"))
					translatable = true;
				else if(sc.Compare("armor"))
					armor = true;
				else if(sc.Compare("interpolate"))
				{
					sc.MustGetToken('(');
					sc.MustGetToken(TK_IntConst);
					interpolationSpeed = sc.Number;
					sc.MustGetToken(')');
				}
				else if(sc.Compare("reverse"))
					reverse = true;
				else
					sc.ScriptError("Unknown drawgem flag '%s'.", sc.String);
				if(!sc.CheckToken('|'))
					sc.MustGetToken(',');
			}
			sc.MustGetToken(TK_StringConst); //chain
			chain = script->newImage(sc.String);
			sc.MustGetToken(',');
			sc.MustGetToken(TK_StringConst); //gem
			gem = script->newImage(sc.String);
			sc.MustGetToken(',');
			bool negative = sc.CheckToken('-');
			sc.MustGetToken(TK_IntConst);
			leftPadding = (negative ? -1 : 1) * sc.Number;
			sc.MustGetToken(',');
			negative = sc.CheckToken('-');
			sc.MustGetToken(TK_IntConst);
			rightPadding = (negative ? -1 : 1) * sc.Number;
			sc.MustGetToken(',');
			sc.MustGetToken(TK_IntConst);
			if(sc.Number < 0)
				sc.ScriptError("Chain size must be a positive number.");
			chainSize = sc.Number+1;
			sc.MustGetToken(',');
			GetCoordinates(sc, fullScreenOffsets, x, y);
			sc.MustGetToken(';');
		
			if(!armor)
				interpolationSpeed = script->interpolateHealth ? script->interpolationSpeed : interpolationSpeed;
			else
				interpolationSpeed = script->interpolateArmor ? script->armorInterpolationSpeed : interpolationSpeed;
		}